

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxDumper.h
# Opt level: O0

Action __thiscall
psy::C::SyntaxDumper::visitExtGNU_ChooseExpression
          (SyntaxDumper *this,ExtGNU_ChooseExpressionSyntax *node)

{
  ExpressionSyntax *pEVar1;
  SyntaxToken local_140;
  SyntaxToken local_108;
  SyntaxToken local_d0;
  SyntaxToken local_98;
  SyntaxToken local_50;
  ExtGNU_ChooseExpressionSyntax *local_18;
  ExtGNU_ChooseExpressionSyntax *node_local;
  SyntaxDumper *this_local;
  
  local_18 = node;
  node_local = (ExtGNU_ChooseExpressionSyntax *)this;
  ExtGNU_ChooseExpressionSyntax::keyword(&local_50,node);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_50,local_18);
  SyntaxToken::~SyntaxToken(&local_50);
  ExtGNU_ChooseExpressionSyntax::openParenthesisToken(&local_98,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_98,local_18);
  SyntaxToken::~SyntaxToken(&local_98);
  pEVar1 = ExtGNU_ChooseExpressionSyntax::constantExpression(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  ExtGNU_ChooseExpressionSyntax::commaToken1(&local_d0,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_d0,local_18);
  SyntaxToken::~SyntaxToken(&local_d0);
  pEVar1 = ExtGNU_ChooseExpressionSyntax::expression1(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  ExtGNU_ChooseExpressionSyntax::commaToken2(&local_108,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_108,local_18);
  SyntaxToken::~SyntaxToken(&local_108);
  pEVar1 = ExtGNU_ChooseExpressionSyntax::expression2(local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5e])(this,pEVar1);
  ExtGNU_ChooseExpressionSyntax::closeParenthesisToken(&local_140,local_18);
  (*(this->super_SyntaxVisitor)._vptr_SyntaxVisitor[0x5d])(this,&local_140,local_18);
  SyntaxToken::~SyntaxToken(&local_140);
  return Skip;
}

Assistant:

virtual Action visitExtGNU_ChooseExpression(const ExtGNU_ChooseExpressionSyntax* node) override
    {
        terminal(node->keyword(), node);
        terminal(node->openParenthesisToken(), node);
        nonterminal(node->constantExpression());
        terminal(node->commaToken1(), node);
        nonterminal(node->expression1());
        terminal(node->commaToken2(), node);
        nonterminal(node->expression2());
        terminal(node->closeParenthesisToken(), node);
        return Action::Skip;
    }